

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.cpp
# Opt level: O1

optional<unsigned_char> __thiscall
Storage::Tape::ZXSpectrum::Parser::get_byte(Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  byte bVar1;
  ushort uVar2;
  SymbolType SVar3;
  ushort uVar4;
  byte bVar5;
  int iVar6;
  
  iVar6 = 8;
  bVar5 = 0;
  do {
    SVar3 = Parser<Storage::Tape::ZXSpectrum::SymbolType>::get_next_symbol
                      ((Parser<Storage::Tape::ZXSpectrum::SymbolType> *)this,tape);
    if (One < SVar3) {
      uVar2 = 0;
      uVar4 = 0;
      goto LAB_00457e16;
    }
    bVar1 = bVar5 * '\x02';
    bVar5 = SVar3 == One | bVar1;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  bVar1 = bVar5 << 4 | bVar1 >> 4;
  bVar1 = bVar1 >> 2 & 0x33 | (bVar1 & 0x33) << 2;
  if (this->machine_type_ == Enterprise) {
    bVar5 = bVar1 >> 1 & 0x55 | (bVar1 & 0x55) * '\x02';
  }
  this->checksum_ = this->checksum_ ^ bVar5;
  uVar4 = (ushort)bVar5;
  uVar2 = 0x100;
LAB_00457e16:
  return (_Optional_base<unsigned_char,_true,_true>)
         (_Optional_base<unsigned_char,_true,_true>)(uVar2 | uVar4);
}

Assistant:

std::optional<uint8_t> Parser::get_byte(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	uint8_t result = 0;
	for(int c = 0; c < 8; c++) {
		const SymbolType symbol = get_next_symbol(tape);
		if(symbol != SymbolType::One && symbol != SymbolType::Zero) return std::nullopt;
		result = uint8_t((result << 1) | (symbol == SymbolType::One));
	}

	if(should_flip_bytes()) {
		result = CRC::reverse_byte(result);
	}

	checksum_ ^= result;
	return result;
}